

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O2

void uv__stream_io(uv_loop_t *loop,uv__io_t *w,uint events)

{
  byte *pbVar1;
  size_t sVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  int *piVar6;
  uint *puVar7;
  cmsghdr *pcVar8;
  uint uVar9;
  uint uVar10;
  uv_stream_t *stream;
  ulong uVar11;
  uint uVar12;
  uint *puVar13;
  ulong uVar14;
  ulong uVar15;
  undefined8 unaff_R14;
  undefined8 uStack_1d0;
  uv_buf_t local_1c8;
  uint local_1b4;
  uint *local_1b0;
  uint local_1a8;
  int local_1a4;
  uv_stream_t *local_1a0;
  ulong local_198;
  cmsghdr *local_190;
  size_t local_188;
  msghdr msg;
  int error;
  undefined4 uStack_144;
  size_t sStack_140;
  
  uVar12 = w[-3].fd;
  if ((0xe < uVar12) || ((0x5080U >> (uVar12 & 0x1f) & 1) == 0)) {
    __assert_fail("stream->type == UV_TCP || stream->type == UV_NAMED_PIPE || stream->type == UV_TTY"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x505,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if ((*(uint *)w[-1].pending_queue & 1) != 0) {
    __assert_fail("!(stream->flags & UV_CLOSING)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x506,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  stream = (uv_stream_t *)(w[-3].watcher_queue + 1);
  lVar5 = *(long *)&w[-1].pevents;
  if (lVar5 != 0) {
    msg.msg_name = (void *)CONCAT44(msg.msg_name._4_4_,4);
    if ((uVar12 != 7) && (uVar12 != 0xc)) {
      __assert_fail("stream->type == UV_TCP || stream->type == UV_NAMED_PIPE",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x53c,"void uv__stream_connect(uv_stream_t *)");
    }
    uVar12 = w[1].pevents;
    if (uVar12 == 0) {
      if (w->fd < 0) {
        __assert_fail("uv__stream_fd(stream) >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                      ,0x548,"void uv__stream_connect(uv_stream_t *)");
      }
      getsockopt(w->fd,1,4,&error,(socklen_t *)&msg);
      uVar12 = -error;
      _error = (char *)CONCAT44(uStack_144,uVar12);
    }
    else {
      _error = (char *)CONCAT44(uStack_144,uVar12);
      w[1].pevents = 0;
    }
    if (uVar12 == 0xffffff8d) {
      return;
    }
    w[-1].pevents = 0;
    w[-1].events = 0;
    if (*(long *)&w[-3].pevents + 0x20 == *(long *)(*(long *)&w[-3].pevents + 0x20)) {
      __assert_fail("uv__has_active_reqs(stream->loop)",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x555,"void uv__stream_connect(uv_stream_t *)");
    }
    lVar3 = *(long *)(lVar5 + 0x10);
    **(long **)(lVar5 + 0x18) = lVar3;
    *(undefined8 *)(lVar3 + 8) = *(undefined8 *)(lVar5 + 0x18);
    if (((int)uVar12 < 0) || (w + 1 == (uv__io_t *)w[1].cb)) {
      uv__io_stop(*(uv_loop_t **)&w[-3].pevents,w,4);
      uVar12 = error;
    }
    if (*(code **)(lVar5 + 0x40) != (code *)0x0) {
      (**(code **)(lVar5 + 0x40))(lVar5);
      uVar12 = error;
    }
    if (w->fd == -1) {
      return;
    }
    if (-1 < (int)uVar12) {
      return;
    }
    uv__stream_flush_write_queue(stream,-0x7d);
    uv__write_callbacks(stream);
    return;
  }
  iVar4 = w->fd;
  if (iVar4 < 0) {
    __assert_fail("uv__stream_fd(stream) >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x50d,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if ((events & 0x19) != 0) {
    *(uint *)w[-1].pending_queue = *(uint *)w[-1].pending_queue & 0xfffffefe;
    if (uVar12 == 7) {
      uVar15 = CONCAT71((int7)((ulong)unaff_R14 >> 8),*(int *)&w[2].cb != 0);
    }
    else {
      uVar15 = 0;
    }
    local_1b0 = &w[1].events;
    iVar4 = 0x20;
    do {
      if (((w[-1].watcher_queue[1] == (void *)0x0) || (((ulong)w[-1].pending_queue[0] & 4) == 0)) ||
         (iVar4 == 0)) goto LAB_004f7662;
      if (w[-1].watcher_queue[0] == (void *)0x0) {
        __assert_fail("stream->alloc_cb != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                      ,0x46c,"void uv__read(uv_stream_t *)");
      }
      local_1c8 = uv_buf_init((char *)0x0,0);
      (*(code *)w[-1].watcher_queue[0])(stream,0x10000,&local_1c8);
      if ((local_1c8.base == (char *)0x0) || (local_1c8.len == 0)) {
        uStack_1d0 = 0xffffffffffffff97;
        goto LAB_004f75b8;
      }
      if (w->fd < 0) {
        __assert_fail("uv__stream_fd(stream) >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                      ,0x477,"void uv__read(uv_stream_t *)");
      }
      local_1a4 = iVar4 + -1;
      if ((char)uVar15 == '\0') {
        while( true ) {
          lVar5 = read(w->fd,local_1c8.base,local_1c8.len);
          if (-1 < lVar5) break;
          piVar6 = __errno_location();
          iVar4 = *piVar6;
          if (iVar4 != 4) goto LAB_004f7595;
        }
      }
      else {
        msg.msg_flags = 0;
        msg.msg_iovlen = 1;
        msg.msg_name = (void *)0x0;
        msg.msg_namelen = 0;
        msg.msg_controllen = 0x110;
        msg.msg_control = &error;
        msg.msg_iov = (iovec *)&local_1c8;
        while (lVar5 = uv__recvmsg(w->fd,&msg,0), lVar5 < 0) {
          piVar6 = __errno_location();
          iVar4 = *piVar6;
          if (iVar4 != 4) goto LAB_004f7595;
        }
      }
      if (lVar5 == 0) {
        uv__stream_eof(stream,&local_1c8);
        goto LAB_004f7662;
      }
      local_188 = local_1c8.len;
      if ((char)uVar15 != '\0') {
        pcVar8 = (cmsghdr *)msg.msg_control;
        if (msg.msg_controllen < 0x10) {
          pcVar8 = (cmsghdr *)0x0;
        }
        local_1a8 = (uint)uVar15;
        local_1b4 = events;
        local_1a0 = stream;
        while (stream = local_1a0, events = local_1b4, pcVar8 != (cmsghdr *)0x0) {
          if (pcVar8->cmsg_type == 1) {
            uVar15 = 0xffffffff;
            uVar12 = 0;
            do {
              uVar10 = uVar12;
              uVar15 = (ulong)((int)uVar15 + 1);
              sVar2 = uVar15 * 4 + 0x10;
              uVar12 = uVar10 + 1;
            } while ((long)sVar2 < (long)pcVar8->cmsg_len);
            if (sVar2 != pcVar8->cmsg_len) {
              __assert_fail("start + CMSG_LEN(count * sizeof(*pi)) == end",
                            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                            ,0x439,"int uv__stream_recv_cmsg(uv_stream_t *, struct msghdr *)");
            }
            uVar14 = (ulong)uVar10;
            uVar11 = 0;
            puVar7 = local_1b0;
            local_198 = uVar14;
            local_190 = pcVar8;
LAB_004f7483:
            if (uVar14 != uVar11) {
              uVar12 = *(uint *)((long)&pcVar8[1].cmsg_len + uVar11 * 4);
              puVar13 = puVar7;
              if (*puVar7 == 0xffffffff) goto LAB_004f7529;
              puVar7 = *(uint **)&w[1].fd;
              if (puVar7 != (uint *)0x0) {
                uVar10 = *puVar7;
                uVar9 = puVar7[1];
                if (uVar10 == uVar9) {
                  puVar7 = (uint *)uv__realloc(puVar7,(ulong)(uVar10 + 7) * 4 + 0xc);
                  if (puVar7 == (uint *)0x0) goto LAB_004f7626;
                  *puVar7 = uVar10 + 8;
                  *(uint **)&w[1].fd = puVar7;
                  uVar9 = puVar7[1];
                  puVar13 = local_1b0;
                  uVar14 = local_198;
                }
LAB_004f7514:
                puVar7[1] = uVar9 + 1;
                puVar7 = puVar7 + (ulong)uVar9 + 2;
                pcVar8 = local_190;
                goto LAB_004f7529;
              }
              puVar7 = (uint *)uv__malloc(0x28);
              if (puVar7 != (uint *)0x0) {
                puVar7[0] = 8;
                puVar7[1] = 0;
                *(uint **)&w[1].fd = puVar7;
                uVar9 = 0;
                puVar13 = local_1b0;
                uVar14 = local_198;
                goto LAB_004f7514;
              }
LAB_004f7626:
              pcVar8 = local_190;
              if (uVar15 < uVar11) {
                uVar15 = uVar11;
              }
              for (; stream = local_1a0, uVar15 != uVar11; uVar11 = uVar11 + 1) {
                uv__close(*(int *)((long)&pcVar8[1].cmsg_len + uVar11 * 4));
              }
              (*(code *)w[-1].watcher_queue[1])(local_1a0,0xfffffffffffffff4,&local_1c8);
              events = local_1b4;
              goto LAB_004f7662;
            }
            goto LAB_004f754b;
          }
          fprintf(_stderr,"ignoring non-SCM_RIGHTS ancillary data: %d\n");
LAB_004f754b:
          pcVar8 = __cmsg_nxthdr((msghdr *)&msg,pcVar8);
          uVar15 = (ulong)local_1a8;
        }
      }
      (*(code *)w[-1].watcher_queue[1])(stream,lVar5,&local_1c8);
      iVar4 = local_1a4;
    } while ((long)local_188 <= lVar5);
    pbVar1 = (byte *)((long)w[-1].pending_queue + 1);
    *pbVar1 = *pbVar1 | 1;
    goto LAB_004f7662;
  }
  goto LAB_004f766f;
LAB_004f7529:
  *puVar7 = uVar12;
  uVar11 = uVar11 + 1;
  puVar7 = puVar13;
  goto LAB_004f7483;
LAB_004f7595:
  if (iVar4 == 0xb) {
    if (((ulong)w[-1].pending_queue[0] & 4) != 0) {
      uv__io_start(*(uv_loop_t **)&w[-3].pevents,w,1);
    }
    uStack_1d0 = 0;
LAB_004f75b8:
    (*(code *)w[-1].watcher_queue[1])(stream,uStack_1d0,&local_1c8);
  }
  else {
    (*(code *)w[-1].watcher_queue[1])(stream,(long)-iVar4,&local_1c8);
    if ((*(uint *)w[-1].pending_queue & 4) != 0) {
      *(uint *)w[-1].pending_queue = *(uint *)w[-1].pending_queue & 0xfffffffb;
      uv__io_stop(*(uv_loop_t **)&w[-3].pevents,w,1);
      iVar4 = uv__io_active(w,4);
      if (((iVar4 == 0) && (uVar12 = *(uint *)w[-1].pending_queue, (uVar12 >> 0xe & 1) != 0)) &&
         (*(uint *)w[-1].pending_queue = uVar12 & 0xffffbfff, (uVar12 >> 0xd & 1) != 0)) {
        piVar6 = (int *)(*(long *)&w[-3].pevents + 8);
        *piVar6 = *piVar6 + -1;
      }
    }
  }
LAB_004f7662:
  iVar4 = w->fd;
  if (iVar4 == -1) {
    return;
  }
LAB_004f766f:
  if (((events & 0x10) != 0) && (((ulong)w[-1].pending_queue[0] & 0x304) == 0x104)) {
    _error = (char *)0x0;
    sStack_140 = 0;
    uv__stream_eof(stream,(uv_buf_t *)&error);
    iVar4 = w->fd;
  }
  if ((events & 0x1c) == 0) {
    return;
  }
  if (iVar4 == -1) {
    return;
  }
  uv__write(stream);
  uv__write_callbacks(stream);
  if (w + 1 != (uv__io_t *)w[1].cb) {
    return;
  }
  uv__io_stop(*(uv_loop_t **)&w[-3].pevents,w,4);
  if ((*(uint *)w[-1].pending_queue & 0x19) != 8) {
    return;
  }
  lVar5 = *(long *)&w[-1].fd;
  if (lVar5 == 0) {
    __assert_fail("stream->shutdown_req",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x2a2,"void uv__drain(uv_stream_t *)");
  }
  *(undefined8 *)&w[-1].fd = 0;
  *(uint *)w[-1].pending_queue = *(uint *)w[-1].pending_queue & 0xffffffe6;
  if (*(long *)&w[-3].pevents + 0x20 == *(long *)(*(long *)&w[-3].pevents + 0x20)) {
    __assert_fail("uv__has_active_reqs(stream->loop)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x2a7,"void uv__drain(uv_stream_t *)");
  }
  lVar3 = *(long *)(lVar5 + 0x10);
  **(long **)(lVar5 + 0x18) = lVar3;
  *(undefined8 *)(lVar3 + 8) = *(undefined8 *)(lVar5 + 0x18);
  iVar4 = shutdown(w->fd,1);
  if (iVar4 != 0) {
    piVar6 = __errno_location();
    if (*piVar6 != 0) {
      iVar4 = -*piVar6;
      goto LAB_004f7751;
    }
  }
  *(byte *)w[-1].pending_queue = *(byte *)w[-1].pending_queue | 0x10;
  iVar4 = 0;
LAB_004f7751:
  if (*(code **)(lVar5 + 0x48) != (code *)0x0) {
    (**(code **)(lVar5 + 0x48))(lVar5,iVar4);
  }
  return;
}

Assistant:

static void uv__stream_io(uv_loop_t* loop, uv__io_t* w, unsigned int events) {
  uv_stream_t* stream;

  stream = container_of(w, uv_stream_t, io_watcher);

  assert(stream->type == UV_TCP ||
         stream->type == UV_NAMED_PIPE ||
         stream->type == UV_TTY);
  assert(!(stream->flags & UV_CLOSING));

  if (stream->connect_req) {
    uv__stream_connect(stream);
    return;
  }

  assert(uv__stream_fd(stream) >= 0);

  /* Ignore POLLHUP here. Even it it's set, there may still be data to read. */
  if (events & (POLLIN | POLLERR | POLLHUP))
    uv__read(stream);

  if (uv__stream_fd(stream) == -1)
    return;  /* read_cb closed stream. */

  /* Short-circuit iff POLLHUP is set, the user is still interested in read
   * events and uv__read() reported a partial read but not EOF. If the EOF
   * flag is set, uv__read() called read_cb with err=UV_EOF and we don't
   * have to do anything. If the partial read flag is not set, we can't
   * report the EOF yet because there is still data to read.
   */
  if ((events & POLLHUP) &&
      (stream->flags & UV_STREAM_READING) &&
      (stream->flags & UV_STREAM_READ_PARTIAL) &&
      !(stream->flags & UV_STREAM_READ_EOF)) {
    uv_buf_t buf = { NULL, 0 };
    uv__stream_eof(stream, &buf);
  }

  if (uv__stream_fd(stream) == -1)
    return;  /* read_cb closed stream. */

  if (events & (POLLOUT | POLLERR | POLLHUP)) {
    uv__write(stream);
    uv__write_callbacks(stream);

    /* Write queue drained. */
    if (QUEUE_EMPTY(&stream->write_queue))
      uv__drain(stream);
  }
}